

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

bool __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::Create
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,ParseTable *ptable,
          size_t stackSize)

{
  uint uVar1;
  size_t *psVar2;
  undefined1 auVar3 [16];
  StdGrammarStackElement *pSVar4;
  StdGrammarStackElement *pSVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->TopState;
  if (uVar1 == 0xffffffff) {
    uVar7 = 0x80;
    if (0x80 < stackSize) {
      uVar7 = stackSize;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
      uVar6 = SUB168(auVar3 * ZEXT816(0x38),0);
    }
    pSVar4 = (StdGrammarStackElement *)operator_new__(uVar6);
    pSVar5 = pSVar4;
    do {
      (pSVar5->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).State = 0xffffffff;
      (pSVar5->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).TerminalMarker =
           0xffffffffffffffff;
      pSVar5->Type = 0;
      (pSVar5->field_1).pData = (void *)0x0;
      pSVar5->Line = 0;
      pSVar5->Offset = 0;
      pSVar5->MaxErrorStrLength = 0x12;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar4 + uVar7);
    psVar2 = this->pValidTokenStackPositions;
    this->pValidTokenStackPositions = (size_t *)0x0;
    if (psVar2 != (size_t *)0x0) {
      operator_delete__(psVar2);
    }
    this->pParseTable = ptable;
    this->pTokenizer = (TokenStream<SGParser::Generator::StdGrammarToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pSVar5 = this->pStack;
    this->pStack = pSVar4;
    if (pSVar5 != (StdGrammarStackElement *)0x0) {
      operator_delete__(pSVar5);
    }
    this->StackSize = uVar7;
    this->StackPosition = 0;
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}